

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTestCaseBase.cpp
# Opt level: O2

string * __thiscall
glcts::TestCaseBase::getInfoLog_abi_cxx11_
          (string *__return_storage_ptr__,TestCaseBase *this,LOG_TYPE log_type,GLuint id)

{
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  TestError *this_00;
  allocator_type local_45;
  GLint n_characters;
  vector<char,_std::allocator<char>_> result_vec;
  long lVar3;
  
  iVar1 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  n_characters = 0;
  if (log_type < (LT_PIPELINE_OBJECT|LT_PROGRAM_OBJECT)) {
    (**(code **)(lVar3 + *(long *)(&DAT_01785bb8 + (ulong)log_type * 8)))(id,0x8b84,&n_characters);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"Could not query info log length!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/esextcTestCaseBase.cpp"
                    ,0x37e);
    std::vector<char,_std::allocator<char>_>::vector(&result_vec,(long)(n_characters + 1),&local_45)
    ;
    (**(code **)(lVar3 + *(long *)(&DAT_01785bd0 + (ulong)log_type * 8)))
              (id,n_characters + 1,0,
               result_vec.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"Could not retrieve info log!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/esextcTestCaseBase.cpp"
                    ,0x391);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,
               result_vec.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start,&local_45);
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              (&result_vec.super__Vector_base<char,_std::allocator<char>_>);
    return __return_storage_ptr__;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Invalid parameter",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/esextcTestCaseBase.cpp"
             ,0x37a);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

std::string TestCaseBase::getInfoLog(LOG_TYPE log_type, glw::GLuint id)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	glw::GLint n_characters = 0;
	/* Retrieve amount of characters needed to store the info log (terminator-inclusive) */
	switch (log_type)
	{
	case LT_SHADER_OBJECT:
		gl.getShaderiv(id, GL_INFO_LOG_LENGTH, &n_characters);
		break;
	case LT_PROGRAM_OBJECT:
		gl.getProgramiv(id, GL_INFO_LOG_LENGTH, &n_characters);
		break;
	case LT_PIPELINE_OBJECT:
		gl.getProgramPipelineiv(id, GL_INFO_LOG_LENGTH, &n_characters);
		break;
	default:
		TCU_FAIL("Invalid parameter");
	}

	/* Check if everything is fine so far */
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not query info log length!");

	/* Allocate buffer */
	std::vector<char> result_vec(n_characters + 1);

	/* Retrieve the info log */
	switch (log_type)
	{
	case LT_SHADER_OBJECT:
		gl.getShaderInfoLog(id, n_characters + 1, 0, &result_vec[0]);
		break;
	case LT_PROGRAM_OBJECT:
		gl.getProgramInfoLog(id, n_characters + 1, 0, &result_vec[0]);
		break;
	case LT_PIPELINE_OBJECT:
		gl.getProgramPipelineInfoLog(id, n_characters + 1, 0, &result_vec[0]);
		break;
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not retrieve info log!");

	return std::string(&result_vec[0]);
}